

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roman_int.cpp
# Opt level: O0

uint32_t __thiscall Roman_int::as_int(Roman_int *this)

{
  _Ios_Openmode _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  ulong uVar6;
  allocator<char> local_1f1;
  string local_1f0;
  string local_1d0 [8];
  string left;
  stringstream local_198 [4];
  uint32_t n;
  stringstream ss;
  Roman_int *this_local;
  
  _Var1 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_198,(string *)this,_Var1);
  uVar2 = get_M((istream *)local_198);
  uVar3 = get_C((istream *)local_198);
  uVar4 = get_X((istream *)local_198);
  uVar5 = get_I((istream *)local_198);
  std::__cxx11::string::string(local_1d0);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_198,local_1d0);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,"Invalid roman numeral.",&local_1f1);
    error(&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
  }
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::~stringstream(local_198);
  return uVar2 + uVar3 + uVar4 + uVar5;
}

Assistant:

uint32_t Roman_int::as_int() const
{
	std::stringstream ss{ m_numerals };
	auto n = get_M(ss) + get_C(ss) + get_X(ss) + get_I(ss);
	std::string left;
	std::getline(ss, left);
	if (!left.empty())
	{
		error("Invalid roman numeral.");
	}
	return n;
}